

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdManifoldMesh.cpp
# Opt level: O1

void __thiscall HACD::TMMesh::Clear(TMMesh *this)

{
  bool bVar1;
  
  do {
    bVar1 = CircularList<HACD::TMMVertex>::Delete(&this->m_vertices);
  } while (bVar1);
  do {
    bVar1 = CircularList<HACD::TMMEdge>::Delete(&this->m_edges);
  } while (bVar1);
  do {
    bVar1 = CircularList<HACD::TMMTriangle>::Delete(&this->m_triangles);
  } while (bVar1);
  return;
}

Assistant:

void TMMesh::Clear()
    {
		m_vertices.Clear();
		m_edges.Clear();
		m_triangles.Clear();
	}